

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void stb__stb_idict_rehash(stb_idict *a,int count)

{
  undefined1 local_50 [8];
  stb_idict b;
  int i;
  int count_local;
  stb_idict *a_local;
  
  b.dv = count;
  stb_idict_init((stb_idict *)local_50,count);
  for (b.ev = 0; b.ev < a->limit; b.ev = b.ev + 1) {
    if ((a->table[b.ev].k != 1) && (a->table[b.ev].k != 3)) {
      stb__stb_idict_addset((stb_idict *)local_50,a->table[b.ev].k,a->table[b.ev].v,1,1,0);
    }
  }
  free(a->table);
  a->table = (stb__stb_idict__hashpair *)b._0_8_;
  a->mask = (uint)b.table;
  a->count = b.table._4_4_;
  a->limit = b.mask;
  a->deleted = b.count;
  a->delete_threshhold = b.limit;
  a->grow_threshhold = b.deleted;
  a->shrink_threshhold = b.delete_threshhold;
  return;
}

Assistant:

stb_define_hash_base(STB_noprefix, stb_idict, short type; short gc; STB_nofields, stb_idict_,stb_idict_,0.85f,
              stb_int32,STB_IEMPTY,STB_IDEL,STB_nocopy,STB_nodelete,STB_nosafe,
              STB_equal,STB_equal,
              return stb_rehash_improved(k);,stb_int32,STB_nonullvalue,0)

stb_idict * stb_idict_new_size(int size)
{
   stb_idict *e = (stb_idict *) malloc(sizeof(*e));
   if (e) {
      if (!stb_is_pow2(size))
         size = 1 << stb_log2_ceil(size);
      stb_idict_init(e, size);
      e->alloced = 1;
   }
   return e;
}